

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O3

void iSortDependencies(Abc_Ntk_t *pNtk,Vec_Int_t **iDep,int *oGroup)

{
  int iVar1;
  int *piVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  Vec_Int_t *p_00;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  Vec_Int_t *__ptr;
  bool bVar12;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 0x10;
  p->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  p->pArray = piVar4;
  pVVar5 = pNtk->vPis;
  if (0 < pVVar5->nSize) {
    lVar11 = 0;
    do {
      __ptr = iDep[lVar11];
      iVar1 = __ptr->nSize;
      if (iVar1 != 1) {
        p_00 = (Vec_Int_t *)malloc(0x10);
        if (iVar1 - 1U < 0xf) {
          iVar1 = 0x10;
        }
        p_00->nSize = 0;
        p_00->nCap = iVar1;
        if (iVar1 == 0) {
          piVar4 = (int *)0x0;
        }
        else {
          piVar4 = (int *)malloc((long)iVar1 << 2);
        }
        p_00->pArray = piVar4;
        if (0 < __ptr->nSize) {
          lVar8 = 0;
          do {
            if (0 < (long)p->nSize) {
              lVar6 = 0;
              do {
                if (p->pArray[lVar6] == oGroup[__ptr->pArray[lVar8]]) goto LAB_0028e1f6;
                lVar6 = lVar6 + 1;
              } while (p->nSize != lVar6);
            }
            Vec_IntPushOrder(p,oGroup[__ptr->pArray[lVar8]]);
            __ptr = iDep[lVar11];
LAB_0028e1f6:
            lVar8 = lVar8 + 1;
          } while (lVar8 < __ptr->nSize);
          iVar1 = p->nSize;
          if (0 < (long)iVar1) {
            lVar8 = 0;
            do {
              if (0 < __ptr->nSize) {
                piVar4 = p->pArray;
                uVar10 = 0;
                do {
                  iVar9 = (int)uVar10;
                  if (iVar9 < 0) {
LAB_0028e343:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                                  ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
                  }
                  if (oGroup[__ptr->pArray[uVar10]] == piVar4[lVar8]) {
                    Vec_IntPush(p_00,__ptr->pArray[uVar10]);
                    __ptr = iDep[lVar11];
                    uVar3 = __ptr->nSize;
                    if (iVar9 < (int)uVar3) {
                      piVar2 = __ptr->pArray;
                      uVar7 = 1;
LAB_0028e27b:
                      if (piVar2[uVar7 - 1] != piVar2[uVar10]) goto code_r0x0028e281;
                      if ((int)uVar7 < (int)uVar3) {
                        do {
                          piVar2[uVar7 - 1] = piVar2[uVar7];
                          uVar7 = uVar7 + 1;
                          uVar3 = __ptr->nSize;
                        } while ((int)uVar7 < (int)uVar3);
                      }
                      uVar3 = uVar3 - 1;
                      __ptr->nSize = uVar3;
                      goto LAB_0028e2b7;
                    }
                    goto LAB_0028e343;
                  }
                  uVar3 = __ptr->nSize;
                  uVar10 = (ulong)(iVar9 + 1);
LAB_0028e2b7:
                } while ((int)uVar10 < (int)uVar3);
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 != iVar1);
          }
        }
        if (__ptr->pArray != (int *)0x0) {
          free(__ptr->pArray);
        }
        free(__ptr);
        iDep[lVar11] = p_00;
        p->nSize = 0;
        pVVar5 = pNtk->vPis;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar5->nSize);
    piVar4 = p->pArray;
  }
  if (piVar4 != (int *)0x0) {
    free(piVar4);
  }
  free(p);
  return;
code_r0x0028e281:
  bVar12 = uVar7 == uVar3;
  uVar7 = uVar7 + 1;
  if (bVar12) goto LAB_0028e2b7;
  goto LAB_0028e27b;
}

Assistant:

void iSortDependencies(Abc_Ntk_t *pNtk, Vec_Int_t** iDep, int* oGroup)
{
    int i, j, k;    
    Vec_Int_t * temp;    
    Vec_Int_t * oGroupList;    

    oGroupList = Vec_IntAlloc( 10 );

    for(i = 0; i < Abc_NtkPiNum(pNtk); i++)
    {
        if(Vec_IntSize(iDep[i]) == 1)
            continue;
        
        temp = Vec_IntAlloc( Vec_IntSize(iDep[i]) );        

        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            Vec_IntPushUniqueOrder(oGroupList, oGroup[Vec_IntEntry(iDep[i], j)]);

        for(j = 0; j < Vec_IntSize(oGroupList); j++)
        {
            for(k = 0; k < Vec_IntSize(iDep[i]); k++)
                if(oGroup[Vec_IntEntry(iDep[i], k)] == Vec_IntEntry(oGroupList, j))
                {
                    Vec_IntPush( temp, Vec_IntEntry(iDep[i], k) );        
                    Vec_IntRemove( iDep[i], Vec_IntEntry(iDep[i], k) );
                    k--;
                }
        }        

        Vec_IntFree( iDep[i] );        
        iDep[i] = temp;
        Vec_IntClear( oGroupList );

        /*printf("Input %d: ", i);
        for(j = 0; j < Vec_IntSize(iDep[i]); j++)
            printf("%d ", Vec_IntEntry(iDep[i], j));
        printf("\n");*/
    }
    
    Vec_IntFree( oGroupList );
}